

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ReadCustomConfigurationFileTree(cmCTest *this,char *dir,cmMakefile *mf)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  reference pbVar5;
  pointer ppVar6;
  string local_e10 [32];
  undefined1 local_df0 [8];
  ostringstream cmCTestLog_msg_7;
  _Self local_c78;
  _Base_ptr local_c70;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_c68;
  iterator it;
  undefined1 local_c40 [8];
  ostringstream cmCTestLog_msg_6;
  string local_ac8 [32];
  undefined1 local_aa8 [8];
  ostringstream cmCTestLog_msg_5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_928;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_920;
  iterator fileIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  Glob gl;
  undefined1 local_898 [8];
  ostringstream cmCTestLog_msg_4;
  allocator local_719;
  undefined1 local_718 [8];
  string rexpr;
  undefined1 local_6d8 [8];
  ostringstream cmCTestLog_msg_3;
  string local_558 [7];
  bool erroroc;
  undefined1 local_538 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3c0 [32];
  undefined1 local_3a0 [8];
  ostringstream cmCTestLog_msg_1;
  allocator local_221;
  string local_220 [8];
  string fname;
  undefined1 local_1d0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_58 [8];
  VectorOfStrings ndirs;
  VectorOfStrings dirs;
  bool found;
  cmMakefile *mf_local;
  char *dir_local;
  cmCTest *this_local;
  
  bVar2 = false;
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::vector
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
             &ndirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::vector
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_58);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar3 = std::operator<<((ostream *)local_1d0,"* Read custom CTest configuration directory: ");
  poVar3 = std::operator<<(poVar3,dir);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xa5b,pcVar4,false);
  std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,dir,&local_221);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::operator+=(local_220,"/CTestCustom.cmake");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
  poVar3 = std::operator<<((ostream *)local_3a0,"* Check for file: ");
  poVar3 = std::operator<<(poVar3,local_220);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xa60,pcVar4,false);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar4);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
    poVar3 = std::operator<<((ostream *)local_538,"* Read custom CTest configuration file: ");
    poVar3 = std::operator<<(poVar3,local_220);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0xa64,pcVar4,false);
    std::__cxx11::string::~string(local_558);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    cmSystemTools::ResetErrorOccuredFlag();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmMakefile::ReadListFile(mf,pcVar4);
    if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d8);
      poVar3 = std::operator<<((ostream *)local_6d8,"Problem reading custom configuration: ");
      poVar3 = std::operator<<(poVar3,local_220);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0xa6d,pcVar4,false);
      std::__cxx11::string::~string((string *)(rexpr.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d8);
    }
    bVar2 = true;
    if (bVar1) {
      cmSystemTools::SetErrorOccured();
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_718,dir,&local_719);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::__cxx11::string::operator+=((string *)local_718,"/CTestCustom.ctest");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_898);
  poVar3 = std::operator<<((ostream *)local_898,"* Check for file: ");
  poVar3 = std::operator<<(poVar3,(string *)local_718);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xa79,pcVar4,false);
  std::__cxx11::string::~string((string *)&gl.ListDirs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_898);
  if (!bVar2) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar4);
    if (bVar1) {
      cmsys::Glob::Glob((Glob *)&files);
      cmsys::Glob::RecurseOn((Glob *)&files);
      cmsys::Glob::FindFiles((Glob *)&files,(string *)local_718,(GlobMessages *)0x0);
      fileIt._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&files);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_920);
      local_928 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(fileIt._M_current);
      local_920._M_current = local_928;
      while( true ) {
        local_930._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(fileIt._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_920,&local_930);
        if (!bVar2) break;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_aa8);
        poVar3 = std::operator<<((ostream *)local_aa8,"* Read custom CTest configuration file: ");
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_920);
        poVar3 = std::operator<<(poVar3,(string *)pbVar5);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        Log(this,0,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0xa85,pcVar4,false);
        std::__cxx11::string::~string(local_ac8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_aa8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_920);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmMakefile::ReadListFile(mf,pcVar4);
        if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c40);
          poVar3 = std::operator<<((ostream *)local_c40,"Problem reading custom configuration: ");
          pbVar5 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_920);
          poVar3 = std::operator<<(poVar3,(string *)pbVar5);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
              ,0xa8b,pcVar4,false);
          std::__cxx11::string::~string((string *)&it);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c40);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_920);
      }
      bVar2 = true;
      cmsys::Glob::~Glob((Glob *)&files);
    }
  }
  if (bVar2) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
    ::_Rb_tree_iterator(&local_c68);
    local_c70 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                ::begin(&this->TestingHandlers);
    local_c68._M_node = local_c70;
    while( true ) {
      local_c78._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
           ::end(&this->TestingHandlers);
      bVar2 = std::operator!=(&local_c68,&local_c78);
      if (!bVar2) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_df0);
      poVar3 = std::operator<<((ostream *)local_df0,
                               "* Read custom CTest configuration vectors for handler: ");
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator->(&local_c68);
      poVar3 = std::operator<<(poVar3,(string *)ppVar6);
      poVar3 = std::operator<<(poVar3," (");
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator->(&local_c68);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar6->second);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0xa99,pcVar4,false);
      std::__cxx11::string::~string(local_e10);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_df0);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator->(&local_c68);
      (*(ppVar6->second->super_cmObject)._vptr_cmObject[4])(ppVar6->second,mf);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
      ::operator++(&local_c68);
    }
  }
  std::__cxx11::string::~string((string *)local_718);
  std::__cxx11::string::~string(local_220);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_58);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
             &ndirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int cmCTest::ReadCustomConfigurationFileTree(const char* dir, cmMakefile* mf)
{
  bool found = false;
  VectorOfStrings dirs;
  VectorOfStrings ndirs;
  cmCTestLog(this, DEBUG, "* Read custom CTest configuration directory: "
    << dir << std::endl);

  std::string fname = dir;
  fname += "/CTestCustom.cmake";
  cmCTestLog(this, DEBUG, "* Check for file: "
    << fname << std::endl);
  if ( cmSystemTools::FileExists(fname.c_str()) )
    {
    cmCTestLog(this, DEBUG, "* Read custom CTest configuration file: "
      << fname << std::endl);
    bool erroroc = cmSystemTools::GetErrorOccuredFlag();
    cmSystemTools::ResetErrorOccuredFlag();

    if ( !mf->ReadListFile(fname.c_str()) ||
      cmSystemTools::GetErrorOccuredFlag() )
      {
      cmCTestLog(this, ERROR_MESSAGE,
        "Problem reading custom configuration: "
        << fname << std::endl);
      }
    found = true;
    if ( erroroc )
      {
      cmSystemTools::SetErrorOccured();
      }
    }

  std::string rexpr = dir;
  rexpr += "/CTestCustom.ctest";
  cmCTestLog(this, DEBUG, "* Check for file: "
    << rexpr << std::endl);
  if ( !found && cmSystemTools::FileExists(rexpr.c_str()) )
    {
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.FindFiles(rexpr);
    std::vector<std::string>& files = gl.GetFiles();
    std::vector<std::string>::iterator fileIt;
    for ( fileIt = files.begin(); fileIt != files.end();
      ++ fileIt )
      {
      cmCTestLog(this, DEBUG, "* Read custom CTest configuration file: "
        << *fileIt << std::endl);
      if ( !mf->ReadListFile(fileIt->c_str()) ||
        cmSystemTools::GetErrorOccuredFlag() )
        {
        cmCTestLog(this, ERROR_MESSAGE,
          "Problem reading custom configuration: "
          << *fileIt << std::endl);
        }
      }
    found = true;
    }

  if ( found )
    {
    cmCTest::t_TestingHandlers::iterator it;
    for ( it = this->TestingHandlers.begin();
      it != this->TestingHandlers.end(); ++ it )
      {
      cmCTestLog(this, DEBUG,
        "* Read custom CTest configuration vectors for handler: "
        << it->first << " (" << it->second << ")" << std::endl);
      it->second->PopulateCustomVectors(mf);
      }
    }

  return 1;
}